

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O2

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,Test *searchRoot,string *pathAsString)

{
  iterator *this_00;
  __type _Var1;
  int iVar2;
  Test *pTVar3;
  size_type sVar4;
  undefined4 extraout_var;
  reference pbVar5;
  undefined4 extraout_var_00;
  invalid_argument *this_01;
  int childIndex;
  ulong uVar6;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  PathTestNames testNames;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_0014d178;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_Deque_base
            (&(this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>);
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&testNames.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  pTVar3 = findActualRoot(this,searchRoot,pathAsString,&testNames);
  (*this->_vptr_TestPath[3])(this,pTVar3);
  __n = 1;
  this_00 = &testNames.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  do {
    sVar4 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&testNames);
    if (sVar4 <= __n) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&testNames);
      return;
    }
    uVar6 = 0;
    while( true ) {
      iVar2 = (*pTVar3->_vptr_Test[4])(pTVar3);
      if (iVar2 <= (int)uVar6) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        pbVar5 = std::
                 _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 ::operator[](this_00,__n);
        std::operator+(&local_e0,"TestPath::TestPath(): failed to resolve test name <",pbVar5);
        std::operator+(&local_c0,&local_e0,"> of path <");
        std::operator+(&local_a0,&local_c0,pathAsString);
        std::operator+(&local_100,&local_a0,">");
        std::invalid_argument::invalid_argument(this_01,(string *)&local_100);
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar2 = (*pTVar3->_vptr_Test[5])(pTVar3,uVar6);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                (&local_100,(long *)CONCAT44(extraout_var,iVar2));
      pbVar5 = std::
               _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               ::operator[](this_00,__n);
      _Var1 = std::operator==(&local_100,pbVar5);
      std::__cxx11::string::~string((string *)&local_100);
      if (_Var1) break;
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    iVar2 = (*pTVar3->_vptr_Test[5])(pTVar3,uVar6);
    pTVar3 = (Test *)CONCAT44(extraout_var_00,iVar2);
    (*this->_vptr_TestPath[3])(this,pTVar3);
    __n = (ulong)((int)__n + 1);
  } while( true );
}

Assistant:

TestPath::TestPath( Test *searchRoot, 
                    const std::string &pathAsString )
    : m_tests()
{
  PathTestNames testNames;

  Test *parentTest = findActualRoot( searchRoot, pathAsString, testNames );
  add( parentTest );

  for ( unsigned int index = 1; index < testNames.size(); ++index )
  {
    bool childFound = false;
    for ( int childIndex =0; childIndex < parentTest->getChildTestCount(); ++childIndex )
    {
      if ( parentTest->getChildTestAt( childIndex )->getName() == testNames[index] )
      {
        childFound = true;
        parentTest = parentTest->getChildTestAt( childIndex );
        break;
      }
    }

    if ( !childFound )
      throw std::invalid_argument( "TestPath::TestPath(): failed to resolve test name <"+
                                   testNames[index] + "> of path <" + pathAsString + ">" );

    add( parentTest );
  }
}